

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O1

uint32_t spvtools::val::anon_unknown_0::getScalarAlignment
                   (uint32_t type_id,ValidationState_t *vstate)

{
  uint16_t uVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  Instruction *pIVar5;
  ulong uVar6;
  ulong uVar7;
  void *local_38;
  long lStack_30;
  long local_28;
  
LAB_002d9822:
  pIVar5 = ValidationState_t::FindDef(vstate,type_id);
  uVar1 = (pIVar5->inst_).opcode;
  switch(uVar1) {
  case 0x15:
  case 0x16:
    uVar3 = (pIVar5->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[2];
LAB_002d9874:
    uVar4 = uVar3 >> 3;
    break;
  case 0x17:
  case 0x18:
  case 0x1c:
  case 0x1d:
    goto switchD_002d983f_caseD_17;
  case 0x19:
  case 0x1a:
  case 0x1b:
    bVar2 = EnumSet<spv::Capability>::contains(&vstate->module_capabilities_,BindlessTextureNV);
    if (!bVar2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                    ,0xf8,
                    "uint32_t spvtools::val::(anonymous namespace)::getScalarAlignment(uint32_t, ValidationState_t &)"
                   );
    }
    uVar3 = ValidationState_t::samplerimage_variable_address_mode(vstate);
    goto LAB_002d9874;
  case 0x1e:
    pIVar5 = ValidationState_t::FindDef(vstate,type_id);
    local_38 = (void *)0x0;
    lStack_30 = 0;
    local_28 = 0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,
               (pIVar5->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + 2,
               (pIVar5->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    uVar6 = (ulong)(lStack_30 - (long)local_38) >> 2;
    if ((int)uVar6 == 0) {
      uVar3 = 1;
    }
    else {
      uVar3 = 1;
      uVar7 = 0;
      do {
        uVar4 = getScalarAlignment(*(uint32_t *)((long)local_38 + uVar7 * 4),vstate);
        if (uVar3 < uVar4) {
          uVar3 = uVar4;
        }
        uVar7 = uVar7 + 1;
      } while ((uVar6 & 0xffffffff) != uVar7);
    }
    if (local_38 == (void *)0x0) {
      return uVar3;
    }
    operator_delete(local_38,local_28 - (long)local_38);
    return uVar3;
  case 0x1f:
switchD_002d983f_caseD_1f:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                  ,0x115,
                  "uint32_t spvtools::val::(anonymous namespace)::getScalarAlignment(uint32_t, ValidationState_t &)"
                 );
  default:
    if (uVar1 != 0x1141) goto switchD_002d983f_caseD_1f;
  case 0x20:
    uVar4 = vstate->pointer_size_and_alignment_;
  }
  return uVar4;
switchD_002d983f_caseD_17:
  type_id = (pIVar5->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[2];
  goto LAB_002d9822;
}

Assistant:

uint32_t getScalarAlignment(uint32_t type_id, ValidationState_t& vstate) {
  const auto inst = vstate.FindDef(type_id);
  const auto& words = inst->words();
  switch (inst->opcode()) {
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeSampler:
    case spv::Op::OpTypeImage:
      if (vstate.HasCapability(spv::Capability::BindlessTextureNV))
        return vstate.samplerimage_variable_address_mode() / 8;
      assert(0);
      return 0;
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
      return words[2] / 8;
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray: {
      const auto compositeMemberTypeId = words[2];
      return getScalarAlignment(compositeMemberTypeId, vstate);
    }
    case spv::Op::OpTypeStruct: {
      const auto members = getStructMembers(type_id, vstate);
      uint32_t max_member_alignment = 1;
      for (uint32_t memberIdx = 0, numMembers = uint32_t(members.size());
           memberIdx < numMembers; ++memberIdx) {
        const auto id = members[memberIdx];
        uint32_t member_alignment = getScalarAlignment(id, vstate);
        if (member_alignment > max_member_alignment) {
          max_member_alignment = member_alignment;
        }
      }
      return max_member_alignment;
    } break;
    case spv::Op::OpTypePointer:
    case spv::Op::OpTypeUntypedPointerKHR:
      return vstate.pointer_size_and_alignment();
    default:
      assert(0);
      break;
  }

  return 1;
}